

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

char * google::protobuf::compiler::java::BoxedPrimitiveTypeName(JavaType type)

{
  LogMessage *other;
  char *pcVar1;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (type < (JAVATYPE_MESSAGE|JAVATYPE_LONG)) {
    pcVar1 = (&PTR_anon_var_dwarf_ceb9a_0041f5a8)[type];
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x169);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* BoxedPrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT    : return "java.lang.Integer";
    case JAVATYPE_LONG   : return "java.lang.Long";
    case JAVATYPE_FLOAT  : return "java.lang.Float";
    case JAVATYPE_DOUBLE : return "java.lang.Double";
    case JAVATYPE_BOOLEAN: return "java.lang.Boolean";
    case JAVATYPE_STRING : return "java.lang.String";
    case JAVATYPE_BYTES  : return "com.google.protobuf.ByteString";
    case JAVATYPE_ENUM   : return NULL;
    case JAVATYPE_MESSAGE: return NULL;

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}